

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::InsertLinkDirectory(cmTarget *this,string *entry,cmListFileBacktrace *bt,bool before)

{
  cmTargetInternals *pcVar1;
  const_iterator __position;
  
  pcVar1 = (this->Internal).Pointer;
  __position._M_current =
       (&(pcVar1->LinkDirectoriesBacktraces).
         super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
         super__Vector_impl_data._M_start)[!before];
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&pcVar1->LinkDirectoriesEntries,
           (&(pcVar1->LinkDirectoriesEntries).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)[!before],entry);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::insert
            (&((this->Internal).Pointer)->LinkDirectoriesBacktraces,__position,bt);
  return;
}

Assistant:

void cmTarget::InsertLinkDirectory(std::string const& entry,
                                   cmListFileBacktrace const& bt, bool before)
{
  std::vector<std::string>::iterator position = before
    ? this->Internal->LinkDirectoriesEntries.begin()
    : this->Internal->LinkDirectoriesEntries.end();

  std::vector<cmListFileBacktrace>::iterator btPosition = before
    ? this->Internal->LinkDirectoriesBacktraces.begin()
    : this->Internal->LinkDirectoriesBacktraces.end();

  this->Internal->LinkDirectoriesEntries.insert(position, entry);
  this->Internal->LinkDirectoriesBacktraces.insert(btPosition, bt);
}